

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *maxviol,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *sumviol)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  type_conflict5 tVar11;
  VarStatus VVar12;
  pointer pnVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  byte bVar21;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar21 = 0;
  bVar2 = this->_hasBasis;
  if (bVar2 == true) {
    _syncRealSolution(this);
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sumviol,0.0);
    puVar1 = (maxviol->m_backend).data._M_elems + 1;
    uVar16 = (this->_realLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    while (0 < (int)uVar16) {
      uVar4 = uVar16 - 1;
      VVar12 = basisRowStatus(this,uVar16 - 1);
      uVar16 = uVar4;
      if (this->_currentSettings->_intParamValues[0] == -1) {
        if ((VVar12 & ~FIXED) != ON_UPPER) {
          local_b0.data._M_elems[0] = 0;
          local_b0.data._M_elems[1] = 0;
          tVar11 = boost::multiprecision::operator<
                             ((this->_solReal)._dual.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,(double *)&local_b0)
          ;
          if (tVar11) {
            pnVar13 = (this->_solReal)._dual.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar17 = pnVar13 + uVar4;
            pcVar20 = &local_b0;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar20->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4);
            }
            local_b0.exp = pnVar13[uVar4].m_backend.exp;
            local_b0.neg = pnVar13[uVar4].m_backend.neg;
            local_b0.fpclass = pnVar13[uVar4].m_backend.fpclass;
            local_b0.prec_elem = pnVar13[uVar4].m_backend.prec_elem;
            if (local_b0.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
              local_b0.neg = (bool)(local_b0.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&sumviol->m_backend,&local_b0);
            pnVar13 = (this->_solReal)._dual.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar18 = maxviol;
            pcVar20 = &local_b0;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar20->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4);
            }
            local_b0.exp = (maxviol->m_backend).exp;
            local_b0.neg = (maxviol->m_backend).neg;
            local_b0.fpclass = (maxviol->m_backend).fpclass;
            local_b0.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_b0.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
              local_b0.neg = (bool)(local_b0.neg ^ 1);
            }
            tVar11 = boost::multiprecision::operator<
                               (pnVar13 + uVar4,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b0);
            if (tVar11) {
              pnVar13 = (this->_solReal)._dual.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4;
              uVar6 = (pnVar13->m_backend).data._M_elems[0];
              lVar14 = 0x1b;
              puVar19 = (uint *)((long)&(pnVar13->m_backend).data + 4);
              pcVar20 = &local_b0;
              for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar20->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4)
                ;
              }
              iVar5 = (pnVar13->m_backend).exp;
              uVar8 = (pnVar13->m_backend).fpclass;
              uVar10 = (pnVar13->m_backend).prec_elem;
              bVar3 = (pnVar13->m_backend).neg;
              (maxviol->m_backend).data._M_elems[0] = uVar6;
              pcVar20 = &local_b0;
              puVar19 = puVar1;
              for (; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar19 = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4)
                ;
                puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
              }
              (maxviol->m_backend).exp = iVar5;
              (maxviol->m_backend).neg = (bool)((uVar6 != 0 || uVar8 != 0) ^ bVar3);
              (maxviol->m_backend).fpclass = uVar8;
              (maxviol->m_backend).prec_elem = uVar10;
            }
          }
        }
        if (VVar12 - ZERO < 0xfffffffe) {
          local_b0.data._M_elems[0] = 0;
          local_b0.data._M_elems[1] = 0;
          tVar11 = boost::multiprecision::operator>
                             ((this->_solReal)._dual.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,(double *)&local_b0)
          ;
          if (tVar11) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&sumviol->m_backend,
                       &(this->_solReal)._dual.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4].m_backend);
            tVar11 = boost::multiprecision::operator>
                               ((this->_solReal)._dual.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar4,maxviol);
            if (tVar11) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._dual.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].m_backend);
            }
          }
        }
      }
      else {
        if ((VVar12 & ~FIXED) != ON_UPPER) {
          local_b0.data._M_elems[0] = 0;
          local_b0.data._M_elems[1] = 0;
          tVar11 = boost::multiprecision::operator>
                             ((this->_solReal)._dual.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,(double *)&local_b0)
          ;
          if (tVar11) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&sumviol->m_backend,
                       &(this->_solReal)._dual.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4].m_backend);
            tVar11 = boost::multiprecision::operator>
                               ((this->_solReal)._dual.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar4,maxviol);
            if (tVar11) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._dual.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].m_backend);
            }
          }
        }
        if (VVar12 - ZERO < 0xfffffffe) {
          local_b0.data._M_elems[0] = 0;
          local_b0.data._M_elems[1] = 0;
          tVar11 = boost::multiprecision::operator<
                             ((this->_solReal)._dual.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,(double *)&local_b0)
          ;
          if (tVar11) {
            pnVar13 = (this->_solReal)._dual.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar17 = pnVar13 + uVar4;
            pcVar20 = &local_b0;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar20->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4);
            }
            local_b0.exp = pnVar13[uVar4].m_backend.exp;
            local_b0.neg = pnVar13[uVar4].m_backend.neg;
            local_b0.fpclass = pnVar13[uVar4].m_backend.fpclass;
            local_b0.prec_elem = pnVar13[uVar4].m_backend.prec_elem;
            if (local_b0.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
              local_b0.neg = (bool)(local_b0.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&sumviol->m_backend,&local_b0);
            pnVar13 = (this->_solReal)._dual.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar18 = maxviol;
            pcVar20 = &local_b0;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar20->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4);
            }
            local_b0.exp = (maxviol->m_backend).exp;
            local_b0.neg = (maxviol->m_backend).neg;
            local_b0.fpclass = (maxviol->m_backend).fpclass;
            local_b0.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_b0.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
              local_b0.neg = (bool)(local_b0.neg ^ 1);
            }
            tVar11 = boost::multiprecision::operator<
                               (pnVar13 + uVar4,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b0);
            if (tVar11) {
              pnVar13 = (this->_solReal)._dual.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4;
              uVar4 = (pnVar13->m_backend).data._M_elems[0];
              lVar14 = 0x1b;
              puVar19 = (uint *)((long)&(pnVar13->m_backend).data + 4);
              pcVar20 = &local_b0;
              for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar20->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4)
                ;
              }
              iVar5 = (pnVar13->m_backend).exp;
              uVar7 = (pnVar13->m_backend).fpclass;
              uVar9 = (pnVar13->m_backend).prec_elem;
              bVar3 = (pnVar13->m_backend).neg;
              (maxviol->m_backend).data._M_elems[0] = uVar4;
              pcVar20 = &local_b0;
              puVar19 = puVar1;
              for (; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar19 = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4)
                ;
                puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
              }
              (maxviol->m_backend).exp = iVar5;
              (maxviol->m_backend).neg = (bool)((uVar4 != 0 || uVar7 != 0) ^ bVar3);
              (maxviol->m_backend).fpclass = uVar7;
              (maxviol->m_backend).prec_elem = uVar9;
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}